

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O0

void write_entity_type_palettes(World *world,ROM *rom)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
  *this_01;
  array<Color,_6UL> *__one;
  array<Color,_6UL> *__two;
  ulong uVar2;
  EntityLowPalette *__args;
  array<Color,_7UL> *__one_00;
  array<Color,_7UL> *__two_00;
  EntityHighPalette *__args_00;
  size_type sVar3;
  LandstalkerException *pLVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  reference local_1c0;
  EntityHighPalette *palette_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *__range1_2;
  ByteArray high_palettes_bytes;
  allocator<char> local_169;
  string local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  reference local_130;
  EntityLowPalette *palette;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *__range1_1;
  ByteArray low_palettes_bytes;
  allocator<char> local_d9;
  string local_d8;
  ulong local_b8;
  size_t i_1;
  ulong uStack_a8;
  uint8_t palette_id_1;
  size_t i;
  uint8_t palette_id;
  type *local_90;
  type *entity_type;
  type *id;
  _Self local_78;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
  *__range1;
  ByteArray entity_palette_uses;
  vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> high_palettes;
  vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> low_palettes;
  ROM *rom_local;
  World *world_local;
  
  std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::vector
            ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
             &high_palettes.
              super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::vector
            ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
             &entity_palette_uses.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteArray::ByteArray((ByteArray *)&__range1);
  this_01 = World::entity_types(world);
  __end1 = std::
           map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
           ::begin(this_01);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
       ::end(this_01);
  do {
    bVar1 = std::operator==(&__end1,&local_78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ByteArray::add_word((ByteArray *)&__range1,0xffff);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
      if (0x2a6 < sVar3) {
        pLVar4 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,
                   "Entity palette uses table must not be bigger than the one from base game",
                   &local_d9);
        LandstalkerException::LandstalkerException(pLVar4,&local_d8);
        __cxa_throw(pLVar4,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &low_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
      md::ROM::set_bytes(rom,0x1a453a,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &low_palettes_bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &low_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ByteArray::ByteArray((ByteArray *)&__range1_1);
      this = &high_palettes.
              super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      __end1_1 = std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::begin
                           ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)this);
      palette = (EntityLowPalette *)
                std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::end
                          ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)this);
      while (bVar1 = __gnu_cxx::
                     operator==<ColorPalette<6UL>_*,_std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>_>
                               (&__end1_1,
                                (__normal_iterator<ColorPalette<6UL>_*,_std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>_>
                                 *)&palette), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_130 = __gnu_cxx::
                    __normal_iterator<ColorPalette<6UL>_*,_std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>_>
                    ::operator*(&__end1_1);
        ColorPalette<6UL>::to_bytes((ByteArray *)&local_148,local_130);
        ByteArray::add_bytes((ByteArray *)&__range1_1,&local_148);
        ByteArray::~ByteArray((ByteArray *)&local_148);
        __gnu_cxx::
        __normal_iterator<ColorPalette<6UL>_*,_std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>_>
        ::operator++(&__end1_1);
      }
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1);
      if (sVar3 < 0x3c1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &high_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1);
        md::ROM::set_bytes(rom,0x1a47e0,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &high_palettes_bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &high_palettes_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ByteArray::ByteArray((ByteArray *)&__range1_2);
        this_00 = &entity_palette_uses.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        __end1_2 = std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::begin
                             ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                              this_00);
        palette_1 = (EntityHighPalette *)
                    std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::end
                              ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                               this_00);
        while (bVar1 = __gnu_cxx::
                       operator==<ColorPalette<7UL>_*,_std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>_>
                                 (&__end1_2,
                                  (__normal_iterator<ColorPalette<7UL>_*,_std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>_>
                                   *)&palette_1), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_1c0 = __gnu_cxx::
                      __normal_iterator<ColorPalette<7UL>_*,_std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>_>
                      ::operator*(&__end1_2);
          ColorPalette<7UL>::to_bytes((ByteArray *)&local_1d8,local_1c0);
          ByteArray::add_bytes((ByteArray *)&__range1_2,&local_1d8);
          ByteArray::~ByteArray((ByteArray *)&local_1d8);
          __gnu_cxx::
          __normal_iterator<ColorPalette<7UL>_*,_std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>_>
          ::operator++(&__end1_2);
        }
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_2);
        if (sVar3 < 0xef) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_218,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_2
                    );
          md::ROM::set_bytes(rom,0x1a4ba0,&local_218);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_218);
          ByteArray::~ByteArray((ByteArray *)&__range1_2);
          ByteArray::~ByteArray((ByteArray *)&__range1_1);
          ByteArray::~ByteArray((ByteArray *)&__range1);
          std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::~vector
                    ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                     &entity_palette_uses.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::~vector
                    ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                     &high_palettes.
                      super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          return;
        }
        local_1fa = 1;
        pLVar4 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,
                   "Entity high palettes table must not be bigger than the one from base game",
                   &local_1f9);
        LandstalkerException::LandstalkerException(pLVar4,&local_1f8);
        local_1fa = 0;
        __cxa_throw(pLVar4,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      pLVar4 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,
                 "Entity low palettes table must not be bigger than the one from base game",
                 &local_169);
      LandstalkerException::LandstalkerException(pLVar4,&local_168);
      __cxa_throw(pLVar4,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException
                 );
    }
    id = &std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_EntityType_*>_>::operator*
                    (&__end1)->first;
    entity_type = (type *)std::get<0ul,unsigned_char_const,EntityType*>
                                    ((pair<const_unsigned_char,_EntityType_*> *)id);
    local_90 = std::get<1ul,unsigned_char_const,EntityType*>
                         ((pair<const_unsigned_char,_EntityType_*> *)id);
    bVar1 = EntityType::has_low_palette(*local_90);
    if (bVar1) {
      sVar3 = std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::size
                        ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                         &high_palettes.
                          super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      i._3_1_ = (byte)sVar3;
      for (uStack_a8 = 0; uVar2 = uStack_a8,
          sVar3 = std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::size
                            ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                             &high_palettes.
                              super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar2 < sVar3;
          uStack_a8 = uStack_a8 + 1) {
        __one = &std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::at
                           ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                            &high_palettes.
                             super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,uStack_a8)->
                 super_array<Color,_6UL>;
        __two = &EntityType::low_palette(*local_90)->super_array<Color,_6UL>;
        bVar1 = std::operator==(__one,__two);
        if (bVar1) {
          i._3_1_ = (byte)uStack_a8;
          break;
        }
      }
      uVar2 = (ulong)i._3_1_;
      sVar3 = std::vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_>::size
                        ((vector<ColorPalette<6UL>,_std::allocator<ColorPalette<6UL>_>_> *)
                         &high_palettes.
                          super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (uVar2 == sVar3) {
        __args = EntityType::low_palette(*local_90);
        std::vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>>::
        emplace_back<ColorPalette<6ul>&>
                  ((vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>> *)
                   &high_palettes.
                    super__Vector_base<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,__args);
      }
      ByteArray::add_byte((ByteArray *)&__range1,*(uint8_t *)entity_type);
      ByteArray::add_byte((ByteArray *)&__range1,i._3_1_ & 0x7f);
    }
    bVar1 = EntityType::has_high_palette(*local_90);
    if (bVar1) {
      sVar3 = std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::size
                        ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                         &entity_palette_uses.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      i_1._7_1_ = (byte)sVar3;
      for (local_b8 = 0; uVar2 = local_b8,
          sVar3 = std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::size
                            ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                             &entity_palette_uses.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage), uVar2 < sVar3;
          local_b8 = local_b8 + 1) {
        __one_00 = &std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::operator[]
                              ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                               &entity_palette_uses.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_b8)->
                    super_array<Color,_7UL>;
        __two_00 = &EntityType::high_palette(*local_90)->super_array<Color,_7UL>;
        bVar1 = std::operator==(__one_00,__two_00);
        if (bVar1) {
          i_1._7_1_ = (byte)local_b8;
          break;
        }
      }
      uVar2 = (ulong)i_1._7_1_;
      sVar3 = std::vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_>::size
                        ((vector<ColorPalette<7UL>,_std::allocator<ColorPalette<7UL>_>_> *)
                         &entity_palette_uses.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (uVar2 == sVar3) {
        __args_00 = EntityType::high_palette(*local_90);
        std::vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>>::
        emplace_back<ColorPalette<7ul>&>
                  ((vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>> *)
                   &entity_palette_uses.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,__args_00);
      }
      ByteArray::add_byte((ByteArray *)&__range1,*(uint8_t *)entity_type);
      ByteArray::add_byte((ByteArray *)&__range1,i_1._7_1_ | 0x80);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_EntityType_*>_>::operator++(&__end1)
    ;
  } while( true );
}

Assistant:

static void write_entity_type_palettes(const World& world, md::ROM& rom)
{
    // Build arrays for low & high palettes
    std::vector<EntityLowPalette> low_palettes;
    std::vector<EntityHighPalette> high_palettes;

    ByteArray entity_palette_uses;
    for(auto& [id, entity_type] : world.entity_types())
    {
        if(entity_type->has_low_palette())
        {
            uint8_t palette_id = low_palettes.size();
            for(size_t i=0 ; i<low_palettes.size() ; ++i)
            {
                if(low_palettes.at(i) == entity_type->low_palette())
                {
                    palette_id = i;
                    break;
                }
            }
            if(palette_id == low_palettes.size())
                low_palettes.emplace_back(entity_type->low_palette());

            entity_palette_uses.add_byte(id);
            entity_palette_uses.add_byte(palette_id & 0x7F);
        }

        if(entity_type->has_high_palette())
        {
            uint8_t palette_id = high_palettes.size();
            for(size_t i=0 ; i<high_palettes.size() ; ++i)
            {
                if(high_palettes[i] == entity_type->high_palette())
                {
                    palette_id = i;
                    break;
                }
            }
            if(palette_id == high_palettes.size())
                high_palettes.emplace_back(entity_type->high_palette());

            entity_palette_uses.add_byte(id);
            entity_palette_uses.add_byte(0x80 + (palette_id & 0x7F));
        }
    }
    entity_palette_uses.add_word(0xFFFF);

    // Write the palette uses table, referencing which entity uses which palette(s)
    if(entity_palette_uses.size() > offsets::ENTITY_PALETTES_TABLE_END - offsets::ENTITY_PALETTES_TABLE)
        throw LandstalkerException("Entity palette uses table must not be bigger than the one from base game");
    rom.set_bytes(offsets::ENTITY_PALETTES_TABLE, entity_palette_uses);

    // Write the low palettes contents
    ByteArray low_palettes_bytes;
    for(const EntityLowPalette& palette : low_palettes)
        low_palettes_bytes.add_bytes(palette.to_bytes());

    if(low_palettes_bytes.size() > offsets::ENTITY_PALETTES_TABLE_LOW_END - offsets::ENTITY_PALETTES_TABLE_LOW)
        throw LandstalkerException("Entity low palettes table must not be bigger than the one from base game");
    rom.set_bytes(offsets::ENTITY_PALETTES_TABLE_LOW, low_palettes_bytes);

    // Write the high palettes contents
    ByteArray high_palettes_bytes;
    for(const EntityHighPalette& palette : high_palettes)
        high_palettes_bytes.add_bytes(palette.to_bytes());
    if(high_palettes_bytes.size() > offsets::ENTITY_PALETTES_TABLE_HIGH_END - offsets::ENTITY_PALETTES_TABLE_HIGH)
        throw LandstalkerException("Entity high palettes table must not be bigger than the one from base game");
    rom.set_bytes(offsets::ENTITY_PALETTES_TABLE_HIGH, high_palettes_bytes);
}